

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O1

string * __thiscall
pstore::
basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,(anonymous_namespace)::mock_file_system_traits>
::make_file_name_abi_cxx11_(string *__return_storage_ptr__,void *this,uint index)

{
  ostream *poVar1;
  ostringstream str;
  char local_199;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,*(char **)((long)this + 0x58),*(long *)((long)this + 0x60));
  if (index != 0) {
    local_199 = '.';
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_199,1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string basic_rotating_log<StreamTraits, FileSystemTraits>::make_file_name (
        unsigned const index) const {
        std::ostringstream str;
        str << base_name_;
        if (index > 0) {
            str << '.' << index;
        }
        return str.str ();
    }